

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,size_type limit)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  cmOutputConverter *pcVar1;
  pointer pbVar2;
  cmMakefileTargetGeneratorObjectStrings local_d0;
  cmStateSnapshot local_48;
  
  this_00 = this->LocalGenerator;
  pcVar1 = &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_00 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    pcVar1 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_48,(cmLocalGenerator *)this_00);
  cmStateSnapshot::GetDirectory(&local_d0.StateDir,&local_48);
  local_d0.CurrentString._M_dataplus._M_p = (pointer)&local_d0.CurrentString.field_2;
  local_d0.CurrentString._M_string_length = 0;
  local_d0.CurrentString.field_2._M_local_buf[0] = '\0';
  local_d0.NextObject._M_dataplus._M_p = (pointer)&local_d0.NextObject.field_2;
  local_d0.NextObject._M_string_length = 0;
  local_d0.NextObject.field_2._M_local_buf[0] = '\0';
  local_d0.Space = "";
  local_d0.Strings = objStrings;
  local_d0.OutputConverter = pcVar1;
  local_d0.LengthLimit = limit;
  for (pbVar2 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar2);
  }
  for (pbVar2 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar2);
  }
  cmMakefileTargetGeneratorObjectStrings::Done(&local_d0);
  cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings(&local_d0);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, std::string::size_type limit)
{
  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::vector<std::string>::const_iterator i = this->Objects.begin();
       i != this->Objects.end(); ++i) {
    helper.Feed(*i);
  }
  for (std::vector<std::string>::const_iterator i =
         this->ExternalObjects.begin();
       i != this->ExternalObjects.end(); ++i) {
    helper.Feed(*i);
  }
  helper.Done();
}